

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O1

bool __thiscall Jinx::Variant::GetBoolean(Variant *this)

{
  bool bVar1;
  undefined1 uVar2;
  Variant v;
  Variant local_30;
  
  if (this->m_type == Boolean) {
    uVar2 = (this->field_1).m_boolean;
  }
  else {
    Copy(&local_30,this);
    bVar1 = ConvertTo(&local_30,Boolean);
    if (bVar1) {
      uVar2 = GetBoolean(&local_30);
    }
    else {
      uVar2 = false;
    }
    Destroy(&local_30);
  }
  return (bool)uVar2;
}

Assistant:

inline bool Variant::GetBoolean() const
	{
		if (IsBoolean())
			return m_boolean;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::Boolean))
			return false;
		return v.GetBoolean();
	}